

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O3

UConverter *
ucnv_createConverterFromPackage_63(char *packageName,char *converterName,UErrorCode *err)

{
  UConverterSharedData *mySharedConverterData;
  UConverter *converter;
  UConverterNamePieces stackPieces;
  UConverterLoadArgs local_120;
  UConverterNamePieces local_f8;
  
  local_120.name = (char *)0x0;
  local_120.locale = (char *)0x0;
  local_120.onlyTestIsLoadable = '\0';
  local_120.reserved0 = '\0';
  local_120.reserved = 0;
  local_120.options = 0;
  local_120.pkg = (char *)0x0;
  local_120.size = 0x28;
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
    local_f8.cnvName[0] = '\0';
    local_f8.locale[0] = '\0';
    local_f8.options = 0;
    parseConverterOptions(converterName,&local_f8,&local_120,err);
    if (U_ZERO_ERROR < *err) {
      return (UConverter *)0x0;
    }
    local_120.nestedLoads = 1;
    local_120.pkg = packageName;
    mySharedConverterData = createConverterFromFile(&local_120,err);
    if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
      converter = ucnv_createConverterFromSharedData_63
                            ((UConverter *)0x0,mySharedConverterData,&local_120,err);
      if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
        return converter;
      }
      ucnv_close_63(converter);
    }
  }
  return (UConverter *)0x0;
}

Assistant:

U_CFUNC UConverter*
ucnv_createConverterFromPackage(const char *packageName, const char *converterName, UErrorCode * err)
{
    UConverter *myUConverter;
    UConverterSharedData *mySharedConverterData;
    UConverterNamePieces stackPieces;
    UConverterLoadArgs stackArgs=UCNV_LOAD_ARGS_INITIALIZER;

    UTRACE_ENTRY_OC(UTRACE_UCNV_OPEN_PACKAGE);

    if(U_FAILURE(*err)) {
        UTRACE_EXIT_STATUS(*err);
        return NULL;
    }

    UTRACE_DATA2(UTRACE_OPEN_CLOSE, "open converter %s from package %s", converterName, packageName);

    /* first, get the options out of the converterName string */
    stackPieces.cnvName[0] = 0;
    stackPieces.locale[0] = 0;
    stackPieces.options = 0;
    parseConverterOptions(converterName, &stackPieces, &stackArgs, err);
    if (U_FAILURE(*err)) {
        /* Very bad name used. */
        UTRACE_EXIT_STATUS(*err);
        return NULL;
    }
    stackArgs.nestedLoads=1;
    stackArgs.pkg=packageName;

    /* open the data, unflatten the shared structure */
    mySharedConverterData = createConverterFromFile(&stackArgs, err);

    if (U_FAILURE(*err)) {
        UTRACE_EXIT_STATUS(*err);
        return NULL;
    }

    /* create the actual converter */
    myUConverter = ucnv_createConverterFromSharedData(NULL, mySharedConverterData, &stackArgs, err);

    if (U_FAILURE(*err)) {
        ucnv_close(myUConverter);
        UTRACE_EXIT_STATUS(*err);
        return NULL;
    }

    UTRACE_EXIT_PTR_STATUS(myUConverter, *err);
    return myUConverter;
}